

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab3-0.c
# Opt level: O1

int feederBig2(void)

{
  DWORD DVar1;
  int iVar2;
  DWORD DVar3;
  uint uVar4;
  FILE *__stream;
  int iVar5;
  
  __stream = fopen("in.txt","w+");
  if (__stream == (FILE *)0x0) {
    puts("can\'t create in.txt. No space on disk?");
LAB_001027f8:
    iVar5 = -1;
  }
  else {
    printf("Creating large array... ");
    fflush(_stdout);
    DVar1 = GetTickCount();
    fprintf(__stream,"%d\n",2000000);
    iVar5 = 200000;
    do {
      iVar2 = fprintf(__stream,"0 0 0 0 0 0 0 0 0 0 ");
      if (iVar2 == -1) {
        puts("can\'t create in.txt. No space on disk?");
        fclose(__stream);
        goto LAB_001027f8;
      }
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    fputc(10,__stream);
    fclose(__stream);
    DVar3 = GetTickCount();
    uVar4 = RoundUptoThousand(DVar3 - DVar1);
    iVar5 = 0;
    printf("done in T=%u seconds. Starting exe with timeout 2*T+3... ",(ulong)uVar4 / 1000);
    LabTimeout = uVar4 * 2 + 3000;
    fflush(_stdout);
    LabMemoryLimit = 1;
  }
  return iVar5;
}

Assistant:

static int feederBig2(void)
{
    FILE *const in = fopen("in.txt", "w+");
    int i;
    DWORD t;
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    printf("Creating large array... ");
    fflush(stdout);
    t = GetTickCount();
    fprintf(in, "%d\n", 2000000);
    for (i = 0; i < 200000; i++) {
        if (fprintf(in, "0 0 0 0 0 0 0 0 0 0 ") == EOF) {
            printf("can't create in.txt. No space on disk?\n");
            fclose(in);
            return -1;
        }
    }
    fprintf(in, "\n");
    fclose(in);
    t = RoundUptoThousand(GetTickCount() - t);
    printf("done in T=%u seconds. Starting exe with timeout 2*T+3... ", (unsigned)t/1000);
    LabTimeout = (int)t*2+3000;
    fflush(stdout);
    LabMemoryLimit = MIN_PROCESS_RSS_BYTES+4*2000000;
    return 0;
}